

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O1

int mixed_make_segment_space_mixer(uint32_t samplerate,mixed_segment *segment)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  mixed_channel_t mVar4;
  mixed_channel_t mVar5;
  mixed_channel_t mVar6;
  mixed_channel_t mVar7;
  mixed_channel_t mVar8;
  mixed_channel_t mVar9;
  mixed_channel_t mVar10;
  int iVar11;
  space_mixer_data *data;
  mixed_buffer **ppmVar12;
  mixed_channel_configuration *pmVar13;
  
  data = (space_mixer_data *)(*mixed_calloc)(1,0x5518);
  if (data == (space_mixer_data *)0x0) {
    mixed_err(1);
  }
  else {
    iVar11 = make_fft_window_data(0x800,4,samplerate,&data->fft_window_data);
    if (iVar11 != 0) {
      ppmVar12 = (mixed_buffer **)(*mixed_calloc)(2,8);
      data->out = ppmVar12;
      if (ppmVar12 == (mixed_buffer **)0x0) {
        iVar11 = 1;
      }
      else {
        pmVar13 = mixed_default_channel_configuration('\x02');
        mVar4 = pmVar13->positions[0];
        mVar5 = pmVar13->positions[1];
        mVar6 = pmVar13->positions[2];
        mVar7 = pmVar13->positions[3];
        mVar8 = pmVar13->positions[4];
        mVar9 = pmVar13->positions[5];
        mVar10 = pmVar13->positions[6];
        uVar1 = *(undefined8 *)(pmVar13->positions + 7);
        uVar2 = *(undefined8 *)(pmVar13->positions + 0xf);
        uVar3 = *(undefined8 *)(pmVar13->positions + 0x17);
        (data->channels).count = pmVar13->count;
        (data->channels).positions[0] = mVar4;
        (data->channels).positions[1] = mVar5;
        (data->channels).positions[2] = mVar6;
        (data->channels).positions[3] = mVar7;
        (data->channels).positions[4] = mVar8;
        (data->channels).positions[5] = mVar9;
        (data->channels).positions[6] = mVar10;
        *(undefined8 *)((data->channels).positions + 7) = uVar1;
        *(undefined8 *)((data->channels).positions + 0xf) = uVar2;
        *(undefined8 *)((data->channels).positions + 0x17) = uVar3;
        *(undefined2 *)((data->channels).positions + 0x1f) =
             *(undefined2 *)(pmVar13->positions + 0x1f);
        iVar11 = make_vbap_from_configuration(&data->channels,&data->vbap);
        if (iVar11 != 0) {
          data->direction[2] = 1.0;
          data->up[1] = 1.0;
          data->soundspeed = 34330.0;
          data->doppler_factor = 0.0;
          data->min_distance = 10.0;
          data->max_distance = 100000.0;
          data->rolloff = 0.5;
          data->volume = 1.0;
          data->attenuation = attenuation_exponential;
          recompute_look_at(data);
          segment->free = space_mixer_free;
          segment->info = space_mixer_info;
          segment->start = space_mixer_start;
          segment->mix = (_func_int_mixed_segment_ptr *)&LAB_00105430;
          segment->set_in = space_mixer_set_in;
          segment->get_in = space_mixer_get_in;
          segment->set_out = space_mixer_set_out;
          segment->get_out = space_mixer_get_out;
          segment->set = space_mixer_set;
          segment->get = space_mixer_get;
          segment->data = data;
          return 1;
        }
        iVar11 = 0x1c;
      }
      mixed_err(iVar11);
    }
    free_fft_window_data(&data->fft_window_data);
    (*mixed_free)(data);
  }
  return 0;
}

Assistant:

MIXED_EXPORT int mixed_make_segment_space_mixer(uint32_t samplerate, struct mixed_segment *segment){
  struct space_mixer_data *data = mixed_calloc(1, sizeof(struct space_mixer_data));
  if(!data){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }

  // These factors might need tweaking for efficiency/quality.
  if(!make_fft_window_data(2048, 4, samplerate, &data->fft_window_data)){
    goto cleanup;
  }

  data->out = mixed_calloc(2, sizeof(struct mixed_buffer *));
  if(!data->out){
    mixed_err(MIXED_OUT_OF_MEMORY);
    goto cleanup;
  }

  memcpy(&data->channels, mixed_default_channel_configuration(2), sizeof(struct mixed_channel_configuration));
  if(!make_vbap_from_configuration(&data->channels, &data->vbap)){
    mixed_err(MIXED_INTERNAL_ERROR);
    goto cleanup;
  }

  data->direction[2] = 1.0;      // Facing in Z+ direction
  data->up[1] = 1.0;             // OpenGL-like. Y+ is up.
  data->soundspeed = 34330.0;    // Means units are in [cm].
  data->doppler_factor = 0.0;
  data->min_distance = 10.0;      // That's 10 centimetres.
  data->max_distance = 100000.0;  // That's a kilometre.
  data->rolloff = 0.5;
  data->attenuation = attenuation_exponential;
  data->volume = 1.0;
  recompute_look_at(data);
  
  segment->free = space_mixer_free;
  segment->info = space_mixer_info;
  segment->start = space_mixer_start;
  segment->mix = space_mixer_mix;
  segment->set_in = space_mixer_set_in;
  segment->get_in = space_mixer_get_in;
  segment->set_out = space_mixer_set_out;
  segment->get_out = space_mixer_get_out;
  segment->set = space_mixer_set;
  segment->get = space_mixer_get;
  segment->data = data;
  return 1;

 cleanup:
  free_fft_window_data(&data->fft_window_data);
  mixed_free(data);
  return 0;
}